

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Int_t * Pdr_InvMinimizeLits(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *p_00;
  sat_solver *pSat;
  Vec_Int_t *p_01;
  int *piVar5;
  long lVar6;
  Gia_Man_t *pGVar7;
  int *piVar8;
  ulong uVar9;
  timespec ts;
  uint local_78;
  uint local_74;
  long local_58;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    local_58 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_58 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  piVar1 = vInv->pArray;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  piVar8 = piVar1 + 1;
  local_74 = 0;
  if (0 < *piVar1) {
    local_78 = 0;
    local_74 = 0;
    piVar5 = piVar8;
    do {
      iVar3 = *piVar5;
      if (0 < iVar3) {
        uVar9 = 0;
        do {
          iVar3 = piVar5[uVar9 + 1];
          piVar5[uVar9 + 1] = -1;
          pSat = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
          pGVar7 = p;
          iVar4 = Pdr_InvCheck_int(p,vInv,0,pSat,1);
          if (iVar4 == 0) {
            if (fVerbose != 0) {
              Abc_Print((int)pGVar7,"Removing lit %d from clause %d.\n",uVar9 & 0xffffffff,
                        (ulong)local_78);
            }
            local_74 = local_74 + 1;
          }
          else {
            piVar5[uVar9 + 1] = iVar3;
          }
          uVar9 = uVar9 + 1;
          sat_solver_delete(pSat);
          iVar3 = *piVar5;
        } while ((long)uVar9 < (long)iVar3);
      }
      local_78 = local_78 + 1;
      piVar5 = piVar5 + (long)iVar3 + 1;
    } while ((int)local_78 < *piVar1);
  }
  Cnf_DataFree(p_00);
  if (local_74 == 0) {
    Abc_Print((int)p_00,"Invariant minimization did not change the invariant.  ");
  }
  else {
    Abc_Print((int)p_00,"Invariant minimization reduced %d literals (out of %d).  ",(ulong)local_74)
    ;
  }
  iVar4 = 3;
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p_01 = (Vec_Int_t *)0x0;
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar6 + local_58) / 1000000.0);
  if (0 < (int)local_74) {
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar5 = (int *)malloc(4000);
    p_01->pArray = piVar5;
    Vec_IntPush(p_01,*piVar1);
    if (0 < *piVar1) {
      iVar3 = 0;
      do {
        iVar4 = 0;
        if (0 < (long)*piVar8) {
          lVar6 = 0;
          iVar4 = 0;
          do {
            lVar2 = lVar6 + 1;
            lVar6 = lVar6 + 1;
            iVar4 = iVar4 + (uint)(piVar8[lVar2] != -1);
          } while (*piVar8 != lVar6);
        }
        Vec_IntPush(p_01,iVar4);
        iVar4 = *piVar8;
        if (0 < iVar4) {
          lVar6 = 0;
          do {
            if (piVar8[lVar6 + 1] != -1) {
              Vec_IntPush(p_01,piVar8[lVar6 + 1]);
            }
            lVar6 = lVar6 + 1;
            iVar4 = *piVar8;
          } while (lVar6 < iVar4);
        }
        iVar3 = iVar3 + 1;
        piVar8 = piVar8 + (long)iVar4 + 1;
      } while (iVar3 < *piVar1);
    }
    if ((long)vInv->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    Vec_IntPush(p_01,vInv->pArray[(long)vInv->nSize + -1]);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Pdr_InvMinimizeLits( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    Vec_Int_t * vRes = NULL;
    abctime clk = Abc_Clock();
    int i, k, nLits = 0, * pCube, * pList = Vec_IntArray(vInv), nRemoved = 0;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat;
//    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Pdr_ForEachCube( pList, pCube, i )
    {
        nLits += pCube[0];
        for ( k = 0; k < pCube[0]; k++ )
        {
            int Save = pCube[k+1];
            pCube[k+1] = -1;
            //sat_solver_bookmark( pSat );
            pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
            if ( Pdr_InvCheck_int(p, vInv, 0, pSat, 1) )
                pCube[k+1] = Save;
            else
            {
                if ( fVerbose )
                Abc_Print(1, "Removing lit %d from clause %d.\n", k, i );
                nRemoved++;
            }
            sat_solver_delete( pSat );
            //sat_solver_rollback( pSat );
            //sat_solver_bookmark( pSat );
        }
    }
    Cnf_DataFree( pCnf );
    //sat_solver_delete( pSat );
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d literals (out of %d).  ", nRemoved, nLits );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( nRemoved > 0 ) // finished without timeout and removed some lits
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, pList[0] );
        Pdr_ForEachCube( pList, pCube, i )
        {
            int nLits = 0;
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    Vec_IntPush( vRes, pCube[k+1] );
        }
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    return vRes;
}